

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O0

bool __thiscall cmCTestVC::WriteXMLUpdates(cmCTestVC *this,cmXMLWriter *param_1)

{
  cmCTest *this_00;
  char *msg;
  string local_1c0 [48];
  ostringstream local_190 [8];
  ostringstream cmCTestLog_msg;
  cmXMLWriter *param_1_local;
  cmCTestVC *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,"* CTest cannot extract updates for this VCS tool.\n");
  this_00 = this->CTest;
  std::__cxx11::ostringstream::str();
  msg = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(this_00,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestVC.cxx"
               ,0xc4,msg,false);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return true;
}

Assistant:

bool cmCTestVC::WriteXMLUpdates(cmXMLWriter& /*unused*/)
{
  cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
             "* CTest cannot extract updates for this VCS tool.\n");
  return true;
}